

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandListBase.hpp
# Opt level: O1

void __thiscall
Diligent::CommandListBase<Diligent::EngineVkImplTraits>::CommandListBase
          (CommandListBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,DeviceContextImplType *pDeferredCtx,bool bIsDeviceInternal)

{
  string *ObjDesc;
  string msg;
  string local_30;
  
  ObjDesc = &local_30;
  local_30._M_dataplus._M_p = (Char *)0x0;
  DeviceObjectBase<Diligent::ICommandList,_Diligent::RenderDeviceVkImpl,_Diligent::CommandListDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::ICommandList,_Diligent::RenderDeviceVkImpl,_Diligent::CommandListDesc>
                     ,pRefCounters,pDevice,(CommandListDesc *)ObjDesc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::ICommandList,_Diligent::RenderDeviceVkImpl,_Diligent::CommandListDesc>
  ).super_ObjectBase<Diligent::ICommandList>.super_RefCountedObject<Diligent::ICommandList>.
  super_ICommandList.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00934b70;
  this->m_QueueId =
       (pDeferredCtx->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.QueueId;
  if ((pDeferredCtx->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == false) {
    FormatString<char[26],char[35]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pDeferredCtx->GetDesc().IsDeferred",(char (*) [35])ObjDesc);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"CommandListBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/CommandListBase.hpp"
               ,0x49);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

CommandListBase(IReferenceCounters*    pRefCounters,
                    RenderDeviceImplType*  pDevice,
                    DeviceContextImplType* pDeferredCtx,
                    bool                   bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, CommandListDesc{}, bIsDeviceInternal},
        m_QueueId{pDeferredCtx->GetDesc().QueueId}
    {
        VERIFY_EXPR(pDeferredCtx->GetDesc().IsDeferred);
    }